

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

bool P_CheckFor3DFloorHit(AActor *mo,double z)

{
  extsector_t *peVar1;
  F3DFloor **ppFVar2;
  long lVar3;
  ASectorAction *this;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  
  if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) {
    peVar1 = mo->Sector->e;
    uVar5 = (ulong)(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar5 != 0) {
      ppFVar2 = (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      lVar6 = 0;
      do {
        lVar3 = *(long *)((long)ppFVar2 + lVar6);
        if ((~*(uint *)(lVar3 + 0x58) & 3) == 0) {
          this = *(ASectorAction **)(*(long *)(lVar3 + 0x68) + 0x1f8);
          if (this != (ASectorAction *)0x0) {
            if (((this->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
              pdVar4 = *(double **)(lVar3 + 0x28);
              if (ABS(z - ((mo->__Pos).Y * pdVar4[1] + pdVar4[3] + (mo->__Pos).X * *pdVar4) *
                          pdVar4[4]) < 1.52587890625e-05) {
                ASectorAction::TriggerAction(this,mo,4);
                return true;
              }
            }
            else {
              *(undefined8 *)(*(long *)(lVar3 + 0x68) + 0x1f8) = 0;
            }
          }
        }
        lVar6 = lVar6 + 8;
      } while (uVar5 << 3 != lVar6);
    }
  }
  return false;
}

Assistant:

bool P_CheckFor3DFloorHit(AActor * mo, double z)
{
	if ((mo->player && (mo->player->cheats & CF_PREDICTING))) return false;

	for (auto rover : mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;

		if(rover->flags & FF_SOLID && rover->model->SecActTarget)
		{
			if (fabs(z - rover->top.plane->ZatPoint(mo)) < EQUAL_EPSILON) 
			{
				rover->model->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
				return true;
			}
		}
	}
	return false;
}